

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O1

void __thiscall gvr::Mesh::savePLY(Mesh *this,char *name,bool all,ply_encoding enc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_01;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_02;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_03;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  int __fd;
  string *name_00;
  long lVar2;
  long lVar3;
  PLYWriter ply;
  string local_290;
  PLYWriter local_270;
  
  PLYWriter::PLYWriter(&local_270);
  PLYWriter::open(&local_270,name,enc);
  Model::setOriginToPLY((Model *)this,&local_270);
  paVar1 = &local_290.field_2;
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"vertex","");
  PLYWriter::addElement(&local_270,&local_290,(long)(this->super_PointCloud).n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"x","");
  PLYWriter::addProperty(&local_270,&local_290,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"y","");
  PLYWriter::addProperty(&local_270,&local_290,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"z","");
  PLYWriter::addProperty(&local_270,&local_290,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((this->super_PointCloud).scanprop != (float *)0x0) {
    local_290._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"scan_size","");
    PLYWriter::addProperty(&local_270,&local_290,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if (!all) goto LAB_0012aa71;
    local_290._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"scan_error","");
    PLYWriter::addProperty(&local_270,&local_290,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    local_290._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"scan_conf","");
    PLYWriter::addProperty(&local_270,&local_290,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
  }
  if (all) {
    if ((this->super_PointCloud).scanpos != (float *)0x0) {
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"sx","");
      PLYWriter::addProperty(&local_270,&local_290,ply_float32);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"sy","");
      PLYWriter::addProperty(&local_270,&local_290,ply_float32);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"sz","");
      PLYWriter::addProperty(&local_270,&local_290,ply_float32);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
    }
    if (all) {
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"nx","");
      PLYWriter::addProperty(&local_270,&local_290,ply_float32);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"ny","");
      PLYWriter::addProperty(&local_270,&local_290,ply_float32);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"nz","");
      PLYWriter::addProperty(&local_270,&local_290,ply_float32);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
    }
  }
LAB_0012aa71:
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"face","");
  PLYWriter::addElement(&local_270,&local_290,(long)this->n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"vertex_indices","");
  name_00 = &local_290;
  __n = 6;
  PLYWriter::addProperty(&local_270,name_00,ply_uint8,ply_uint32);
  __buf_08 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
    __buf_08 = extraout_RDX_00;
  }
  __fd = (int)name_00;
  if (0 < (this->super_PointCloud).n) {
    lVar2 = 0;
    do {
      PLYWriter::write(&local_270,(int)name_00,__buf_08,__n);
      PLYWriter::write(&local_270,(int)name_00,__buf,__n);
      PLYWriter::write(&local_270,(int)name_00,__buf_00,__n);
      __buf_08 = __buf_01;
      if ((this->super_PointCloud).scanprop == (float *)0x0) {
LAB_0012ab9c:
        if (all) {
          if ((this->super_PointCloud).scanpos != (float *)0x0) {
            PLYWriter::write(&local_270,(int)name_00,__buf_08,__n);
            PLYWriter::write(&local_270,(int)name_00,__buf_04,__n);
            PLYWriter::write(&local_270,(int)name_00,__buf_05,__n);
            __buf_08 = extraout_RDX_02;
          }
          if (all) {
            PLYWriter::write(&local_270,(int)name_00,__buf_08,__n);
            PLYWriter::write(&local_270,(int)name_00,__buf_06,__n);
            PLYWriter::write(&local_270,(int)name_00,__buf_07,__n);
            __buf_08 = extraout_RDX_03;
          }
        }
      }
      else {
        PLYWriter::write(&local_270,(int)name_00,__buf_01,__n);
        __buf_08 = __buf_02;
        if (all) {
          PLYWriter::write(&local_270,(int)name_00,__buf_02,__n);
          PLYWriter::write(&local_270,(int)name_00,__buf_03,__n);
          __buf_08 = extraout_RDX_01;
          goto LAB_0012ab9c;
        }
      }
      __fd = (int)name_00;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_PointCloud).n);
  }
  if (0 < this->n) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      PLYWriter::writeListSize(&local_270,3);
      PLYWriter::write(&local_270,*(int *)((long)this->triangle + lVar3),__buf_09,__n);
      PLYWriter::write(&local_270,*(int *)((long)this->triangle + lVar3 + 4),__buf_10,__n);
      __fd = *(int *)((long)this->triangle + lVar3 + 8);
      PLYWriter::write(&local_270,__fd,__buf_11,__n);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar2 < this->n);
  }
  PLYWriter::close(&local_270,__fd);
  PLYWriter::~PLYWriter(&local_270);
  return;
}

Assistant:

void Mesh::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(name, enc);

  // define header

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));
  }

  ply.close();
}